

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O0

void __thiscall
pbrt::SurfaceInteraction::SetIntersectionProperties
          (SurfaceInteraction *this,MaterialHandle *mtl,LightHandle *area,MediumInterface *mi,
          MediumHandle *med)

{
  bool bVar1;
  char (*in_RCX) [3];
  char (*in_RDX) [18];
  char *unaff_RBX;
  char *in_RSI;
  long in_RDI;
  type tVar2;
  LogLevel unaff_retaddr;
  char (*in_stack_00000010) [18];
  float *in_stack_00000018;
  char (*in_stack_00000020) [3];
  double *in_stack_00000028;
  double vb;
  type va;
  Normal3<float> *in_stack_ffffffffffffff88;
  Normal3<float> *in_stack_ffffffffffffff90;
  long lVar3;
  int line;
  
  lVar3 = in_RDI;
  MaterialHandle::operator=
            ((MaterialHandle *)in_stack_ffffffffffffff90,(MaterialHandle *)in_stack_ffffffffffffff88
            );
  line = (int)((ulong)lVar3 >> 0x20);
  LightHandle::operator=
            ((LightHandle *)in_stack_ffffffffffffff90,(LightHandle *)in_stack_ffffffffffffff88);
  tVar2 = Dot<float>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (0.0 <= tVar2) {
    if ((in_RCX == (char (*) [3])0x0) ||
       (bVar1 = MediumInterface::IsMediumTransition((MediumInterface *)0x849b70), !bVar1)) {
      MediumHandle::operator=
                ((MediumHandle *)in_stack_ffffffffffffff90,(MediumHandle *)in_stack_ffffffffffffff88
                );
    }
    else {
      *(char (**) [3])(in_RDI + 0x40) = in_RCX;
    }
    return;
  }
  LogFatal<char_const(&)[18],char_const(&)[3],char_const(&)[18],float&,char_const(&)[3],double&>
            (unaff_retaddr,unaff_RBX,line,in_RSI,in_RDX,in_RCX,in_stack_00000010,in_stack_00000018,
             in_stack_00000020,in_stack_00000028);
}

Assistant:

void SetIntersectionProperties(MaterialHandle mtl, LightHandle area,
                                   const MediumInterface *mi, MediumHandle med) {
        material = mtl;
        areaLight = area;
        CHECK_GE(Dot(n, shading.n), 0.);
        // Set medium properties at surface intersection
        if (mi && mi->IsMediumTransition())
            mediumInterface = mi;
        else
            medium = med;
    }